

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli.c
# Opt level: O2

int save_session_ticket_cb(ptls_save_ticket_t *_self,ptls_t *tls,ptls_iovec_t src)

{
  void **ppvVar1;
  size_t __size;
  
  __size = src.len;
  free(session_info_0);
  session_info_0 = malloc(__size);
  session_info_1 = __size;
  memcpy(session_info_0,src.base,__size);
  ppvVar1 = ptls_get_data_ptr(tls);
  save_session((quicly_transport_parameters_t *)((long)*ppvVar1 + 0x290));
  return 0;
}

Assistant:

int save_session_ticket_cb(ptls_save_ticket_t *_self, ptls_t *tls, ptls_iovec_t src)
{
    free(session_info.tls_ticket.base);
    session_info.tls_ticket = ptls_iovec_init(malloc(src.len), src.len);
    memcpy(session_info.tls_ticket.base, src.base, src.len);

    quicly_conn_t *conn = *ptls_get_data_ptr(tls);
    return save_session(quicly_get_remote_transport_parameters(conn));
}